

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoMesh::FindCloseElement
          (TPZGeoMesh *this,TPZVec<double> *x,int64_t *InitialElIndex,int targetDim)

{
  int64_t iVar1;
  bool bVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  TPZGeoEl *pTVar5;
  TPZGeoNode *this_00;
  mapped_type_conflict4 *pmVar6;
  long lVar7;
  TPZGeoEl *this_01;
  int ic;
  int iVar8;
  TPZGeoEl *pTVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  TPZGeoElSide neighbour;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> distneigh;
  REAL distcenter;
  TPZManVector<double,_3> xcorner;
  TPZGeoElSide centerneigh;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> cornerdist;
  TPZManVector<double,_3> xcenter;
  TPZManVector<TPZManVector<double,_3>,_8> cornercenter;
  TPZGeoEl *local_340;
  undefined1 local_320 [8];
  TPZGeoEl *local_318;
  int local_310;
  TPZGeoElSide local_308;
  TPZGeoEl **local_2f0;
  TPZGeoEl **local_2e8;
  long local_2e0;
  TPZChunkVector<TPZGeoEl_*,_10> *local_2d8;
  double local_2d0;
  TPZManVector<double,_3> local_2c8;
  TPZGeoElSide local_290;
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  local_278;
  TPZManVector<double,_3> local_248;
  TPZManVector<TPZManVector<double,_3>,_8> local_210;
  
  TPZManVector<double,_3>::TPZManVector(&local_248,3);
  TPZManVector<TPZManVector<double,_3>,_8>::TPZManVector(&local_210,0);
  if ((this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements <= *InitialElIndex) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1df);
  }
  local_2d8 = &(this->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_2d8,*InitialElIndex);
  if (*ppTVar4 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgmesh.cpp",
               0x1e4);
  }
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar5 = (TPZGeoEl *)0x0;
  this_01 = *ppTVar4;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pTVar5 == this_01) {
      *InitialElIndex = pTVar5->fIndex;
      local_340 = pTVar5;
      break;
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::clear(&local_278);
    for (iVar8 = 0; iVar3 = (**(code **)(*(long *)this_01 + 0x98))(this_01), iVar8 < iVar3;
        iVar8 = iVar8 + 1) {
      TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
      this_00 = TPZGeoEl::NodePtr(this_01,iVar8);
      TPZGeoNode::GetCoordinates(this_00,&local_2c8.super_TPZVec<double>);
      local_308.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
      lVar7 = 0;
      do {
        dVar10 = x->fStore[lVar7] - (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar7];
        local_308.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)(local_308.super_TPZSavable._vptr_TPZSavable + dVar10 * dVar10);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      if ((double)local_308.super_TPZSavable._vptr_TPZSavable < 0.0) {
        local_308.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)sqrt((double)local_308.super_TPZSavable._vptr_TPZSavable);
      }
      else {
        local_308.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)SQRT((double)local_308.super_TPZSavable._vptr_TPZSavable);
      }
      pmVar6 = std::
               map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
               operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                           *)&local_278,(key_type_conflict *)&local_308);
      *pmVar6 = iVar8;
      TPZManVector<double,_3>::~TPZManVector(&local_2c8);
    }
    TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
    iVar8 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
    local_308.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
    local_308.fSide = iVar8 + -1;
    local_308.fGeoEl = this_01;
    TPZGeoElSide::CenterX(&local_308,&local_2c8.super_TPZVec<double>);
    if (x->fNElements < 1) {
      dVar10 = 0.0;
    }
    else {
      dVar10 = 0.0;
      lVar7 = 0;
      do {
        dVar11 = x->fStore[lVar7] - (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar7];
        dVar10 = dVar10 + dVar11 * dVar11;
        lVar7 = lVar7 + 1;
      } while (x->fNElements != lVar7);
    }
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    TPZManVector<double,_3>::~TPZManVector(&local_2c8);
    if ((dVar10 < *(double *)(local_278._M_impl.super__Rb_tree_header._M_header._M_left + 1)) ||
       (*(double *)(local_278._M_impl.super__Rb_tree_header._M_header._M_left + 1) < 1e-15)) {
      *InitialElIndex = this_01->fIndex;
      pTVar9 = (TPZGeoEl *)0x0;
      bVar2 = false;
      local_340 = this_01;
    }
    else {
      iVar8 = *(int *)&local_278._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      (**(code **)(*(long *)this_01 + 0x188))(local_320,this_01);
      local_308.fGeoEl = (TPZGeoEl *)((ulong)local_308.fGeoEl & 0xffffffff00000000);
      local_308.fSide = 0;
      local_308._20_4_ = 0;
      local_2f0 = &local_308.fGeoEl;
      local_2e0 = 0;
      local_2e8 = local_2f0;
      if (local_318 == this_01) goto LAB_0110c5c5;
      do {
        do {
          iVar3 = (**(code **)(*(long *)local_318 + 0x210))();
          if (iVar3 == targetDim) {
            TPZManVector<double,_3>::TPZManVector(&local_2c8,3);
            pTVar5 = local_318;
            local_290.fSide = (**(code **)(*(long *)local_318 + 0xf0))(local_318);
            local_290.fSide = local_290.fSide + -1;
            local_290.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
            local_290.fGeoEl = pTVar5;
            TPZGeoElSide::CenterX(&local_290,&local_2c8.super_TPZVec<double>);
            if (CONCAT44(local_2c8.super_TPZVec<double>.fNElements._4_4_,
                         (int)local_2c8.super_TPZVec<double>.fNElements) < 1) {
              dVar11 = 0.0;
            }
            else {
              dVar11 = 0.0;
              lVar7 = 0;
              do {
                dVar12 = (double)((long *)local_2c8.super_TPZVec<double>.fStore)[lVar7] -
                         x->fStore[lVar7];
                dVar11 = dVar11 + dVar12 * dVar12;
                lVar7 = lVar7 + 1;
              } while (CONCAT44(local_2c8.super_TPZVec<double>.fNElements._4_4_,
                                (int)local_2c8.super_TPZVec<double>.fNElements) != lVar7);
            }
            if (dVar11 < 0.0) {
              local_2d0 = sqrt(dVar11);
            }
            else {
              local_2d0 = SQRT(dVar11);
            }
            iVar1 = local_318->fIndex;
            pmVar6 = std::
                     map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                     ::operator[]((map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                                   *)&local_308,&local_2d0);
            *pmVar6 = (mapped_type_conflict4)iVar1;
            TPZManVector<double,_3>::~TPZManVector(&local_2c8);
          }
          if (local_318 == (TPZGeoEl *)0x0) {
            local_2c8.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZGeoElSide_01920090;
            local_2c8.super_TPZVec<double>.fStore = (double *)0x0;
            local_2c8.super_TPZVec<double>.fNElements._0_4_ = -1;
          }
          else {
            (**(code **)(*(long *)local_318 + 0x188))(&local_2c8,local_318,local_310);
          }
          local_310 = (int)local_2c8.super_TPZVec<double>.fNElements;
          local_318 = (TPZGeoEl *)local_2c8.super_TPZVec<double>.fStore;
        } while ((TPZGeoEl *)local_2c8.super_TPZVec<double>.fStore != this_01);
LAB_0110c5c5:
      } while (local_310 != iVar8);
      pTVar9 = this_01;
      dVar11 = dVar10;
      if (local_2e0 != 0) {
        ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                            (local_2d8,(long)*(int *)(local_2f0 + 5));
        pTVar9 = *ppTVar4;
        dVar11 = (double)local_2f0[4];
      }
      bVar2 = dVar11 < dVar10;
      if (!bVar2) {
        *InitialElIndex = this_01->fIndex;
        local_340 = this_01;
      }
      std::
      _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
      ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   *)&local_308);
    }
    pTVar5 = this_01;
    this_01 = pTVar9;
  } while (bVar2);
  std::
  _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  ::~_Rb_tree(&local_278);
  TPZManVector<TPZManVector<double,_3>,_8>::~TPZManVector(&local_210);
  TPZManVector<double,_3>::~TPZManVector(&local_248);
  return local_340;
}

Assistant:

TPZGeoEl * TPZGeoMesh::FindCloseElement(TPZVec<REAL> &x, int64_t & InitialElIndex, int targetDim) const
{
    // this method will not work if targetDim == 0 because it navigates through elements of dimension targetDim
    TPZManVector<REAL,3> xcenter(3);
    TPZManVector<TPZManVector<REAL, 3>, 8> cornercenter;
    // what happens if gelnext == 0 or if InitialIndex is out of scope??
    if (InitialElIndex >= fElementVec.NElements()) {
        DebugStop();
    }
    TPZGeoEl *gelnext = ElementVec()[InitialElIndex];
    
    if (gelnext == 0) {
        DebugStop();
    }
    
    TPZGeoEl *gel = 0;
    REAL geldist;
    std::map<REAL,int> cornerdist;
    while (gel != gelnext) {
        gel = gelnext;
        gelnext = 0;
        cornerdist.clear();
        // compute the corner coordinates
        for (int ic=0; ic<gel->NCornerNodes(); ic++) {
            TPZManVector<REAL,3> xcorner(3);
            gel->NodePtr(ic)->GetCoordinates(xcorner);
            REAL dist = 0.;
            for (int i=0; i<3; i++) {
                dist += (x[i]-xcorner[i])*(x[i]-xcorner[i]);
            }
            dist = sqrt(dist);
            cornerdist[dist]=ic;
        }
        // compute the distance of the center of the element
        {
            geldist = 0.;
            TPZManVector<REAL,3> xcenter(3);
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            gelside.CenterX(xcenter);
            geldist = dist(x,xcenter);
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "FindClosestElement Tried element index " << gel->Index() << std::endl;
            sout << "Distance from the center " << geldist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // find the closest corner node
        REAL closestcorner = cornerdist.begin()->first;
        // if the center node is closer than the cornernode, return the element
        if (geldist < closestcorner || closestcorner < 1.e-15) {
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Distance from the closest corner " << closestcorner << "bailing out " << std::endl;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            InitialElIndex = gel->Index();
            return gel;
        }
        // look for all neighbours of the corner side
        TPZGeoElSide gelside(gel,cornerdist.begin()->second);
        TPZGeoElSide neighbour = gelside.Neighbour();
        std::map<REAL,int> distneigh;
        while (neighbour != gelside)
        {
            if (neighbour.Element()->Dimension() == targetDim)
            {
                TPZManVector<REAL,3> center(3);
                TPZGeoElSide centerneigh(neighbour.Element(),neighbour.Element()->NSides()-1);
                centerneigh.CenterX(center);
                REAL distcenter = dist(center,x);
                distneigh[distcenter] = neighbour.Element()->Index();
            }
            neighbour = neighbour.Neighbour();
        }
        // choose the element whose center is closest to the coordinate
        REAL gelnextdist = 0.;
        if (distneigh.size() == 0) {
            gelnext = gel;
            gelnextdist = geldist;
        }
        else {
            gelnext = ElementVec()[distneigh.begin()->second];
            gelnextdist = distneigh.begin()->first;
        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Closest element index " << gelnext->Index() << std::endl;
            sout << "Distance from the center " << gelnextdist << std::endl;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
        // return if its center distance is larger than the distance of the current element
        if (geldist <= gelnextdist) {
            InitialElIndex = gel->Index();
            return gel;
        }
    }
    InitialElIndex = gel->Index();
    return gel;
}